

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

char * mpack_expect_cstr_alloc_unchecked(mpack_reader_t *reader,size_t maxsize,size_t *out_length)

{
  uint32_t uVar1;
  char *pcVar2;
  size_t sVar3;
  
  *out_length = 0;
  if (maxsize == 0) {
    if (reader->error == mpack_ok) {
      reader->error = mpack_error_bug;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_bug);
      }
    }
    pcVar2 = (char *)0x0;
  }
  else {
    sVar3 = 0xffffffff;
    if (maxsize < 0xffffffff) {
      sVar3 = maxsize;
    }
    uVar1 = mpack_expect_str(reader);
    if ((int)sVar3 - 1U < uVar1) {
      uVar1 = 0;
      if (reader->error == mpack_ok) {
        reader->error = mpack_error_too_big;
        reader->end = reader->data;
        if (reader->error_fn != (mpack_reader_error_t)0x0) {
          (*reader->error_fn)(reader,mpack_error_too_big);
          uVar1 = 0;
        }
      }
    }
    pcVar2 = mpack_read_bytes_alloc_impl(reader,(ulong)uVar1,true);
    if (pcVar2 != (char *)0x0) {
      *out_length = (ulong)uVar1;
    }
  }
  return pcVar2;
}

Assistant:

static char* mpack_expect_cstr_alloc_unchecked(mpack_reader_t* reader, size_t maxsize, size_t* out_length) {
    mpack_assert(out_length != NULL, "out_length cannot be NULL");
    *out_length = 0;

    // make sure argument makes sense
    if (maxsize < 1) {
        mpack_break("maxsize is zero; you must have room for at least a null-terminator");
        mpack_reader_flag_error(reader, mpack_error_bug);
        return NULL;
    }

    if (maxsize > UINT32_MAX)
        maxsize = UINT32_MAX;

    size_t length = mpack_expect_str_max(reader, (uint32_t)maxsize - 1);
    char* str = mpack_read_bytes_alloc_impl(reader, length, true);
    mpack_done_str(reader);

    if (str)
        *out_length = length;
    return str;
}